

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O3

pair<jbcoin::PublicKey,_jbcoin::SecretKey> *
jbcoin::generateKeyPair
          (pair<jbcoin::PublicKey,_jbcoin::SecretKey> *__return_storage_ptr__,KeyType type,
          Seed *seed)

{
  Generator g;
  SecretKey sk;
  undefined1 local_70 [48];
  SecretKey local_40;
  
  if (type == secp256k1) {
    Generator::Generator((Generator *)local_70,seed);
    Generator::operator()(__return_storage_ptr__,(Generator *)local_70,seed,0);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
    }
  }
  else {
    generateSecretKey(&local_40,type,seed);
    derivePublicKey((PublicKey *)local_70,type,&local_40);
    (__return_storage_ptr__->first).size_ = local_70._0_8_;
    memcpy((__return_storage_ptr__->first).buf_,local_70 + 8,local_70._0_8_);
    *(undefined8 *)(__return_storage_ptr__->second).buf_ = local_40.buf_._0_8_;
    *(undefined8 *)((__return_storage_ptr__->second).buf_ + 8) = local_40.buf_._8_8_;
    *(undefined8 *)((__return_storage_ptr__->second).buf_ + 0x10) = local_40.buf_._16_8_;
    *(undefined8 *)((__return_storage_ptr__->second).buf_ + 0x18) = local_40.buf_._24_8_;
    beast::secure_erase<void>(&local_40,0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<PublicKey, SecretKey>
generateKeyPair (KeyType type, Seed const& seed)
{
    switch(type)
    {
    case KeyType::secp256k1:
    {
        Generator g(seed);
        return g(seed, 0);
    }
    default:
    case KeyType::ed25519:
    {
        auto const sk = generateSecretKey(type, seed);
        return { derivePublicKey(type, sk), sk };
    }
    }
}